

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_window_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  nghttp2_session *in_RSI;
  nghttp2_frame *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)&(in_RSI->streams).mem == 0) {
    iVar1 = session_on_connection_window_update_received(in_RSI,(nghttp2_frame *)0x113945);
  }
  else {
    iVar1 = session_on_stream_window_update_received
                      ((nghttp2_session *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  }
  return iVar1;
}

Assistant:

int nghttp2_session_on_window_update_received(nghttp2_session *session,
                                              nghttp2_frame *frame) {
  if (frame->hd.stream_id == 0) {
    return session_on_connection_window_update_received(session, frame);
  } else {
    return session_on_stream_window_update_received(session, frame);
  }
}